

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListValueBind<true>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  optional_idx error_location;
  char cVar1;
  reference pvVar2;
  pointer pEVar3;
  BinderException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  ulong __n;
  ulong __n_00;
  idx_t local_170;
  string list_arguments;
  LogicalType child_type;
  bool local_130 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  LogicalType arg_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    duckdb::LogicalType::LogicalType(&child_type,SQLNULL);
  }
  else {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*(pvVar2)
    ;
    duckdb::ExpressionBinder::GetExpressionReturnType((Expression *)&child_type);
  }
  __n_00 = 1;
  while( true ) {
    if ((ulong)((long)(arguments->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(arguments->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n_00) {
      duckdb::LogicalType::NormalizeType((LogicalType *)&list_arguments);
      LogicalType::operator=(&child_type,(LogicalType *)&list_arguments);
      duckdb::LogicalType::~LogicalType((LogicalType *)&list_arguments);
      LogicalType::operator=((LogicalType *)&bound_function->field_0x78,&child_type);
      duckdb::LogicalType::LIST((LogicalType *)&list_arguments);
      LogicalType::operator=
                ((LogicalType *)&bound_function->field_0x90,(LogicalType *)&list_arguments);
      duckdb::LogicalType::~LogicalType((LogicalType *)&list_arguments);
      make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>
                ((duckdb *)&list_arguments,(LogicalType *)&bound_function->field_0x90);
      *(pointer *)this = list_arguments._M_dataplus._M_p;
      duckdb::LogicalType::~LogicalType(&child_type);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,__n_00);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*(pvVar2)
    ;
    duckdb::ExpressionBinder::GetExpressionReturnType((Expression *)&arg_type);
    cVar1 = duckdb::LogicalType::TryGetMaxLogicalType(context,&child_type,&arg_type,&child_type);
    if (cVar1 == '\0') break;
    duckdb::LogicalType::~LogicalType(&arg_type);
    __n_00 = __n_00 + 1;
  }
  std::__cxx11::string::string((string *)&list_arguments,"Full list: ",(allocator *)&error);
  local_170 = list_arguments._M_string_length;
  for (__n = 0; __n < (ulong)((long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    if (__n != 0) {
      std::__cxx11::string::append((char *)&list_arguments);
    }
    if (__n_00 == __n) {
      local_170 = list_arguments._M_string_length;
    }
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,__n);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    (**(code **)(*(long *)pEVar3 + 0x40))(&local_88,pEVar3);
    std::operator+(&local_128,&local_88," ");
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,__n);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              (pvVar2);
    duckdb::LogicalType::ToString_abi_cxx11_();
    std::operator+(&error,&local_128,&local_50);
    std::__cxx11::string::append((string *)&list_arguments);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::string
            (local_a8,"Cannot unpivot columns of types %s and %s - an explicit cast is required",
             (allocator *)&local_128);
  duckdb::LogicalType::ToString_abi_cxx11_();
  duckdb::LogicalType::ToString_abi_cxx11_();
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&error,(StringUtil *)local_a8,&local_c8,&local_e8,in_R8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string(local_a8);
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,__n_00);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  error_location.index = *(idx_t *)(pEVar3 + 0x30);
  optional_idx::optional_idx((optional_idx *)local_130,local_170);
  duckdb::QueryErrorContext::Format
            ((string *)&local_128,(string *)&list_arguments,(optional_idx)&error,local_130[0]);
  BinderException::BinderException<>(this_00,error_location,&local_128);
  __cxa_throw(this_00,&BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> ListValueBind(ClientContext &context, ScalarFunction &bound_function,
                                              vector<unique_ptr<Expression>> &arguments) {
	// collect names and deconflict, construct return type
	LogicalType child_type =
	    arguments.empty() ? LogicalType::SQLNULL : ExpressionBinder::GetExpressionReturnType(*arguments[0]);
	for (idx_t i = 1; i < arguments.size(); i++) {
		auto arg_type = ExpressionBinder::GetExpressionReturnType(*arguments[i]);
		if (!LogicalType::TryGetMaxLogicalType(context, child_type, arg_type, child_type)) {
			if (IS_UNPIVOT) {
				string list_arguments = "Full list: ";
				idx_t error_index = list_arguments.size();
				for (idx_t k = 0; k < arguments.size(); k++) {
					if (k > 0) {
						list_arguments += ", ";
					}
					if (k == i) {
						error_index = list_arguments.size();
					}
					list_arguments += arguments[k]->ToString() + " " + arguments[k]->return_type.ToString();
				}
				auto error =
				    StringUtil::Format("Cannot unpivot columns of types %s and %s - an explicit cast is required",
				                       child_type.ToString(), arg_type.ToString());
				throw BinderException(arguments[i]->GetQueryLocation(),
				                      QueryErrorContext::Format(list_arguments, error, error_index, false));
			} else {
				throw BinderException(arguments[i]->GetQueryLocation(),
				                      "Cannot create a list of types %s and %s - an explicit cast is required",
				                      child_type.ToString(), arg_type.ToString());
			}
		}
	}
	child_type = LogicalType::NormalizeType(child_type);

	// this is more for completeness reasons
	bound_function.varargs = child_type;
	bound_function.return_type = LogicalType::LIST(child_type);
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}